

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_set_gej(secp256k1_ge *r,secp256k1_gej *a)

{
  void *in_RSI;
  void *in_RDI;
  secp256k1_fe z3;
  secp256k1_fe z2;
  secp256k1_fe *in_stack_00000178;
  secp256k1_fe *in_stack_00000180;
  secp256k1_fe *in_stack_ffffffffffffff98;
  secp256k1_fe *in_stack_ffffffffffffffa0;
  
  *(undefined4 *)((long)in_RDI + 0x50) = *(undefined4 *)((long)in_RSI + 0x78);
  secp256k1_fe_inv(in_stack_00000180,in_stack_00000178);
  secp256k1_fe_sqr(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  secp256k1_fe_mul(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(secp256k1_fe *)0x1062e0);
  secp256k1_fe_mul(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(secp256k1_fe *)0x1062f4);
  secp256k1_fe_mul(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(secp256k1_fe *)0x106310);
  secp256k1_fe_set_int((secp256k1_fe *)((long)in_RSI + 0x50),1);
  memcpy(in_RDI,in_RSI,0x28);
  memcpy((void *)((long)in_RDI + 0x28),(void *)((long)in_RSI + 0x28),0x28);
  return;
}

Assistant:

static void secp256k1_ge_set_gej(secp256k1_ge *r, secp256k1_gej *a) {
    secp256k1_fe z2, z3;
    r->infinity = a->infinity;
    secp256k1_fe_inv(&a->z, &a->z);
    secp256k1_fe_sqr(&z2, &a->z);
    secp256k1_fe_mul(&z3, &a->z, &z2);
    secp256k1_fe_mul(&a->x, &a->x, &z2);
    secp256k1_fe_mul(&a->y, &a->y, &z3);
    secp256k1_fe_set_int(&a->z, 1);
    r->x = a->x;
    r->y = a->y;
}